

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_gates.cpp
# Opt level: O2

void lsim::sim_register_gate_functions(Simulator *sim)

{
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:12:5)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:12:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x11,1,(simulation_func_t *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:19:5)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:19:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x12,1,(simulation_func_t *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:32:5)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:32:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x13,1,(simulation_func_t *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:42:5)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:42:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x14,1,(simulation_func_t *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:52:5)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:52:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x15,1,(simulation_func_t *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:58:5)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:58:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x16,1,(simulation_func_t *)&local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:68:5)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:68:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x17,1,(simulation_func_t *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:78:5)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:78:5)>
              ::_M_manager;
  Simulator::register_sim_function(sim,0x18,1,(simulation_func_t *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:86:5)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:86:5)>
              ::_M_manager;
  Simulator::register_sim_function(sim,0x19,1,(simulation_func_t *)&local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  return;
}

Assistant:

void sim_register_gate_functions(Simulator *sim) {

    SIM_INPUT_CHANGED_FUNC_BEGIN(BUFFER) {
        for (auto pin = 0u; pin < comp->num_inputs(); ++pin) {
            auto value = comp->read_pin(comp->input_pin_index(pin));
            comp->write_pin(comp->output_pin_index(pin), value);
        }
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(TRISTATE_BUFFER) {
         if (comp->read_pin(comp->control_pin_index(0)) != VALUE_TRUE) {
            for (auto pin = 0u; pin < comp->num_outputs(); ++pin) {
                comp->write_pin(comp->output_pin_index(pin), VALUE_UNDEFINED);
            }
        } else {
            for (auto pin = 0u; pin < comp->num_inputs(); ++pin) {
                auto value = comp->read_pin(comp->input_pin_index(pin));
                comp->write_pin(comp->output_pin_index(pin), value);
            }
        }
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(AND_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output &= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(OR_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output |= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(NOT_GATE) {
        comp->reset_bad_read_check();
        auto input = comp->read_pin_checked(0);
        comp->write_pin_checked(1, !input);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(NAND_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output &= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), !output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(NOR_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output |= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), !output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(XOR_GATE) {
        comp->reset_bad_read_check();

        auto output = comp->read_pin_checked(0);
        output ^= static_cast<int>(comp->read_pin_checked(1));
        comp->write_pin_checked(2, output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(XNOR_GATE) {
        comp->reset_bad_read_check();

        auto output = comp->read_pin_checked(0);
        output ^= static_cast<int>(comp->read_pin_checked(1));
        comp->write_pin_checked(2, !output);
    } SIM_FUNC_END
}